

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

void __thiscall
llvm::StringRef::split
          (StringRef *this,SmallVectorImpl<llvm::StringRef> *A,StringRef Separator,int MaxSplit,
          bool KeepEmpty)

{
  size_t sVar1;
  ulong uVar2;
  undefined3 in_register_00000089;
  int iVar3;
  StringRef local_68;
  undefined4 local_4c;
  SmallVectorImpl<llvm::StringRef> *local_48;
  StringRef local_40;
  
  local_4c = CONCAT31(in_register_00000089,KeepEmpty);
  local_68.Data = this->Data;
  local_68.Length = this->Length;
  iVar3 = MaxSplit + 1;
  local_48 = A;
  do {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) break;
    sVar1 = find(&local_68,Separator,0);
    if (sVar1 == 0xffffffffffffffff) break;
    if (sVar1 != 0 || KeepEmpty) {
      local_40.Length = local_68.Length;
      if (sVar1 <= local_68.Length) {
        local_40.Length = sVar1;
      }
      local_40.Data = local_68.Data;
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                (&local_48->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_40);
    }
    uVar2 = Separator.Length + sVar1;
    if (local_68.Length < uVar2) {
      uVar2 = local_68.Length;
    }
    local_68.Data = local_68.Data + uVar2;
    local_68.Length = local_68.Length - uVar2;
  } while (sVar1 != 0xffffffffffffffff);
  if (((char)local_4c != '\0') || (local_68.Length != 0)) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              (&local_48->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_68);
  }
  return;
}

Assistant:

void StringRef::split(SmallVectorImpl<StringRef> &A,
                      StringRef Separator, int MaxSplit,
                      bool KeepEmpty) const {
  StringRef S = *this;

  // Count down from MaxSplit. When MaxSplit is -1, this will just split
  // "forever". This doesn't support splitting more than 2^31 times
  // intentionally; if we ever want that we can make MaxSplit a 64-bit integer
  // but that seems unlikely to be useful.
  while (MaxSplit-- != 0) {
    size_t Idx = S.find(Separator);
    if (Idx == npos)
      break;

    // Push this split.
    if (KeepEmpty || Idx > 0)
      A.push_back(S.slice(0, Idx));

    // Jump forward.
    S = S.slice(Idx + Separator.size(), npos);
  }

  // Push the tail.
  if (KeepEmpty || !S.empty())
    A.push_back(S);
}